

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O3

void __thiscall double_conversion::Bignum::SubtractBignum(Bignum *this,Bignum *other)

{
  short sVar1;
  short sVar2;
  bool bVar3;
  long lVar4;
  ushort uVar5;
  uint *puVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  
  Align(this,other);
  if (0 < other->used_bigits_) {
    sVar1 = other->exponent_;
    sVar2 = this->exponent_;
    uVar7 = (ulong)(uint)(int)other->used_bigits_;
    lVar4 = (long)sVar1 * 4 + (long)sVar2 * -4 + 4;
    uVar8 = 0;
    iVar9 = 0;
    do {
      uVar10 = (iVar9 + *(int *)((long)this + uVar8 * 4 + lVar4)) - other->bigits_buffer_[uVar8];
      *(uint *)((long)this + uVar8 * 4 + lVar4) = uVar10 & 0xfffffff;
      iVar9 = (int)uVar10 >> 0x1f;
      uVar8 = uVar8 + 1;
    } while (uVar7 != uVar8);
    if ((int)uVar10 < 0) {
      puVar6 = (uint *)((long)this + (((long)sVar1 + uVar7) - (long)sVar2) * 4);
      do {
        puVar6 = puVar6 + 1;
        uVar10 = *puVar6;
        *puVar6 = uVar10 - 1 & 0xfffffff;
      } while ((int)(uVar10 - 1) < 0);
    }
  }
  uVar5 = this->used_bigits_;
  if ((short)uVar5 < 1) {
    if (uVar5 != 0) {
      return;
    }
  }
  else {
    do {
      if (this->bigits_buffer_[uVar5 - 1] != 0) {
        return;
      }
      this->used_bigits_ = uVar5 - 1;
      bVar3 = 1 < (short)uVar5;
      uVar5 = uVar5 - 1;
    } while (bVar3);
  }
  this->exponent_ = 0;
  return;
}

Assistant:

void Bignum::SubtractBignum(const Bignum& other) {
  DOUBLE_CONVERSION_ASSERT(IsClamped());
  DOUBLE_CONVERSION_ASSERT(other.IsClamped());
  // We require this to be bigger than other.
  DOUBLE_CONVERSION_ASSERT(LessEqual(other, *this));

  Align(other);

  const int offset = other.exponent_ - exponent_;
  Chunk borrow = 0;
  int i;
  for (i = 0; i < other.used_bigits_; ++i) {
    DOUBLE_CONVERSION_ASSERT((borrow == 0) || (borrow == 1));
    const Chunk difference = RawBigit(i + offset) - other.RawBigit(i) - borrow;
    RawBigit(i + offset) = difference & kBigitMask;
    borrow = difference >> (kChunkSize - 1);
  }
  while (borrow != 0) {
    const Chunk difference = RawBigit(i + offset) - borrow;
    RawBigit(i + offset) = difference & kBigitMask;
    borrow = difference >> (kChunkSize - 1);
    ++i;
  }
  Clamp();
}